

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  FBlockNode *pFVar1;
  bool bVar2;
  
  pFVar1 = blocklinks[index];
  while( true ) {
    if (pFVar1 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    if ((pFVar1->Me != mo) &&
       (((param == (void *)0x0 || (bVar2 = AActor::CanSeek(mo,pFVar1->Me), bVar2)) &&
        (bVar2 = AActor::IsOkayToAttack(mo,pFVar1->Me), bVar2)))) break;
    pFVar1 = pFVar1->NextActor;
  }
  return pFVar1->Me;
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	bool onlyseekable = param != NULL;
	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}